

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::TransformFeedback::DrawXFB::checkFramebuffer
          (DrawXFB *this,GLfloat r,GLfloat g,GLfloat b,GLfloat a)

{
  code *pcVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  uchar *puVar4;
  reference pvVar5;
  uint local_6c;
  GLuint i;
  GLubyte ia;
  GLubyte ib;
  GLubyte ig;
  GLubyte ir;
  allocator<unsigned_char> local_51;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  GLuint number_of_pixels;
  Functions *gl;
  GLfloat a_local;
  GLfloat b_local;
  GLfloat g_local;
  GLfloat r_local;
  DrawXFB *this_local;
  
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  std::allocator<unsigned_char>::allocator(&local_51);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0x10,&local_51);
  std::allocator<unsigned_char>::~allocator(&local_51);
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x1220);
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  (*pcVar1)(0,0,2,2,0x1908,0x1401,puVar4);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glReadPixels call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1235);
  local_6c = 0;
  do {
    if (3 < local_6c) {
      this_local._7_1_ = true;
LAB_00e21a30:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
      return this_local._7_1_;
    }
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                        (ulong)(local_6c << 2));
    if (*pvVar5 != (value_type)(int)(r * 255.0)) {
LAB_00e219da:
      this_local._7_1_ = false;
      goto LAB_00e21a30;
    }
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                        (ulong)(local_6c * 4 + 1));
    if (*pvVar5 != (value_type)(int)(g * 255.0)) goto LAB_00e219da;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                        (ulong)(local_6c * 4 + 2));
    if (*pvVar5 != (value_type)(int)(b * 255.0)) goto LAB_00e219da;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                        (ulong)(local_6c * 4 + 3));
    if (*pvVar5 != (value_type)(int)(a * 255.0)) goto LAB_00e219da;
    local_6c = local_6c + 1;
  } while( true );
}

Assistant:

bool gl3cts::TransformFeedback::DrawXFB::checkFramebuffer(glw::GLfloat r, glw::GLfloat g, glw::GLfloat b,
														  glw::GLfloat a)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Number of pixels. */
	const glw::GLuint number_of_pixels = s_view_size * s_view_size;

	/* Fetch framebuffer. */
	std::vector<glw::GLubyte> pixels(number_of_pixels * 4 /* components */);

	if ((s_view_size > 0) && (s_view_size > 0))
	{
		gl.readPixels(0, 0, s_view_size, s_view_size, GL_RGBA, GL_UNSIGNED_BYTE, pixels.data());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");
	}

	/* Convert color to integer. */
	glw::GLubyte ir = (glw::GLubyte)(255.f * r);
	glw::GLubyte ig = (glw::GLubyte)(255.f * g);
	glw::GLubyte ib = (glw::GLubyte)(255.f * b);
	glw::GLubyte ia = (glw::GLubyte)(255.f * a);

	/* Check results. */
	for (glw::GLuint i = 0; i < number_of_pixels; ++i)
	{
		if ((pixels[i * 4 /* components */] != ir) || (pixels[i * 4 /* components */ + 1] != ig) ||
			(pixels[i * 4 /* components */ + 2] != ib) || (pixels[i * 4 /* components */ + 3] != ia))
		{
			return false;
		}
	}

	return true;
}